

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Geometry *pGVar6;
  RTCIntersectArguments *pRVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  ulong uVar19;
  int *piVar20;
  RTCRayQueryContext *pRVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  byte bVar24;
  undefined4 uVar25;
  ulong *puVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined8 uVar45;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  uint uVar59;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar69;
  undefined1 auVar66 [16];
  uint uVar68;
  undefined1 auVar67 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2614;
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  RTCFilterFunctionNArguments local_25d8;
  Scene *local_25a8;
  undefined4 local_25a0;
  undefined4 local_259c;
  undefined4 local_2598;
  float local_2594;
  float local_2590;
  undefined4 local_258c;
  uint local_2588;
  uint local_2584;
  uint local_2580;
  undefined8 local_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2510 [16];
  float local_2500 [4];
  float local_24f0 [4];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [2] [16];
  undefined1 local_2490 [16];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar17 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar9 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    auVar10 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    local_2490._8_4_ = 0x7fffffff;
    local_2490._0_8_ = 0x7fffffff7fffffff;
    local_2490._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx((undefined1  [16])aVar1,local_2490);
    auVar52._8_4_ = 0x219392ef;
    auVar52._0_8_ = 0x219392ef219392ef;
    auVar52._12_4_ = 0x219392ef;
    auVar8 = vcmpps_avx(auVar8,auVar52,1);
    auVar8 = vblendvps_avx((undefined1  [16])aVar1,auVar52,auVar8);
    auVar52 = vrcpps_avx(auVar8);
    auVar53._8_4_ = 0x3f800000;
    auVar53._0_8_ = 0x3f8000003f800000;
    auVar53._12_4_ = 0x3f800000;
    auVar8 = vfnmadd213ps_fma(auVar8,auVar52,auVar53);
    auVar13 = vfmadd132ps_fma(auVar8,auVar52,auVar52);
    fVar43 = auVar13._0_4_;
    local_23c0._4_4_ = fVar43;
    local_23c0._0_4_ = fVar43;
    local_23c0._8_4_ = fVar43;
    local_23c0._12_4_ = fVar43;
    local_23c0._16_4_ = fVar43;
    local_23c0._20_4_ = fVar43;
    local_23c0._24_4_ = fVar43;
    local_23c0._28_4_ = fVar43;
    auVar67 = ZEXT3264(local_23c0);
    auVar8 = vmovshdup_avx(auVar13);
    uVar45 = auVar8._0_8_;
    local_23e0._8_8_ = uVar45;
    local_23e0._0_8_ = uVar45;
    local_23e0._16_8_ = uVar45;
    local_23e0._24_8_ = uVar45;
    auVar71 = ZEXT3264(local_23e0);
    auVar53 = vshufpd_avx(auVar13,auVar13,1);
    auVar52 = vshufps_avx(auVar13,auVar13,0xaa);
    uVar45 = auVar52._0_8_;
    local_2400._8_8_ = uVar45;
    local_2400._0_8_ = uVar45;
    local_2400._16_8_ = uVar45;
    local_2400._24_8_ = uVar45;
    auVar77 = ZEXT3264(local_2400);
    auVar57._0_4_ = fVar43 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar57._4_4_ = auVar13._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar57._8_4_ = auVar13._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar57._12_4_ = auVar13._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar52 = vmovshdup_avx(auVar57);
    auVar13 = vshufps_avx(auVar57,auVar57,0xaa);
    uVar16 = (ulong)(auVar8._0_4_ < 0.0);
    uVar18 = (ulong)(auVar53._0_4_ < 0.0);
    uVar25 = auVar10._0_4_;
    auVar36 = ZEXT3264(CONCAT428(uVar25,CONCAT424(uVar25,CONCAT420(uVar25,CONCAT416(uVar25,CONCAT412
                                                  (uVar25,CONCAT48(uVar25,CONCAT44(uVar25,uVar25))))
                                                  ))));
    uVar22 = CONCAT44(auVar57._0_4_,auVar57._0_4_);
    local_2420._0_8_ = uVar22 ^ 0x8000000080000000;
    local_2420._8_4_ = -auVar57._0_4_;
    local_2420._12_4_ = -auVar57._0_4_;
    local_2420._16_4_ = -auVar57._0_4_;
    local_2420._20_4_ = -auVar57._0_4_;
    local_2420._24_4_ = -auVar57._0_4_;
    local_2420._28_4_ = -auVar57._0_4_;
    auVar79 = ZEXT3264(local_2420);
    uVar29 = auVar52._0_4_;
    uVar59 = auVar52._4_4_;
    local_2440._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
    local_2440._8_4_ = uVar29 ^ 0x80000000;
    local_2440._12_4_ = uVar59 ^ 0x80000000;
    local_2440._16_4_ = uVar29 ^ 0x80000000;
    local_2440._20_4_ = uVar59 ^ 0x80000000;
    local_2440._24_4_ = uVar29 ^ 0x80000000;
    local_2440._28_4_ = uVar59 ^ 0x80000000;
    auVar82 = ZEXT3264(local_2440);
    uVar29 = auVar13._0_4_;
    uVar59 = auVar13._4_4_;
    local_2460._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
    local_2460._8_4_ = uVar29 ^ 0x80000000;
    local_2460._12_4_ = uVar59 ^ 0x80000000;
    local_2460._16_4_ = uVar29 ^ 0x80000000;
    local_2460._20_4_ = uVar59 ^ 0x80000000;
    local_2460._24_4_ = uVar29 ^ 0x80000000;
    local_2460._28_4_ = uVar59 ^ 0x80000000;
    auVar85 = ZEXT3264(local_2460);
    uVar25 = auVar9._0_4_;
    local_2480._4_4_ = uVar25;
    local_2480._0_4_ = uVar25;
    local_2480._8_4_ = uVar25;
    local_2480._12_4_ = uVar25;
    local_2480._16_4_ = uVar25;
    local_2480._20_4_ = uVar25;
    local_2480._24_4_ = uVar25;
    local_2480._28_4_ = uVar25;
    auVar87 = ZEXT3264(local_2480);
    local_2570 = mm_lookupmask_ps._240_8_;
    uStack_2568 = mm_lookupmask_ps._248_8_;
LAB_019b0fe7:
    do {
      pauVar15 = pauVar17 + -1;
      pauVar17 = pauVar17 + -1;
      if (*(float *)(*pauVar15 + 8) <= (ray->super_RayK<1>).tfar) {
        pauVar15 = pauVar17;
        uVar22 = *(ulong *)*pauVar17;
        while (pauVar17 = pauVar15, (uVar22 & 8) == 0) {
          uVar19 = uVar22 & 0xfffffffffffffff0;
          puVar26 = (ulong *)(uVar19 + 0x40);
          if (uVar19 == 0) {
            puVar26 = (ulong *)0x0;
          }
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *puVar26;
          auVar10 = vpmovzxbw_avx(auVar8);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = puVar26[1];
          auVar8 = vpmovzxbw_avx(auVar9);
          auVar8 = vpminuw_avx(auVar10,auVar8);
          auVar8 = vpcmpeqw_avx(auVar10,auVar8);
          auVar8 = vpacksswb_avx(auVar8,auVar8);
          uVar25 = (undefined4)puVar26[6];
          auVar49._4_4_ = uVar25;
          auVar49._0_4_ = uVar25;
          auVar49._8_4_ = uVar25;
          auVar49._12_4_ = uVar25;
          auVar49._16_4_ = uVar25;
          auVar49._20_4_ = uVar25;
          auVar49._24_4_ = uVar25;
          auVar49._28_4_ = uVar25;
          uVar25 = *(undefined4 *)((long)puVar26 + 0x3c);
          auVar54._4_4_ = uVar25;
          auVar54._0_4_ = uVar25;
          auVar54._8_4_ = uVar25;
          auVar54._12_4_ = uVar25;
          auVar54._16_4_ = uVar25;
          auVar54._20_4_ = uVar25;
          auVar54._24_4_ = uVar25;
          auVar54._28_4_ = uVar25;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = puVar26[fVar43 < 0.0];
          auVar12 = vpmovzxbd_avx2(auVar10);
          auVar12 = vcvtdq2ps_avx(auVar12);
          auVar9 = vfmadd213ps_fma(auVar12,auVar54,auVar49);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)((long)puVar26 + ((ulong)(fVar43 < 0.0) * 8 ^ 8));
          auVar12 = vpmovzxbd_avx2(auVar13);
          auVar12 = vcvtdq2ps_avx(auVar12);
          auVar10 = vfmadd213ps_fma(auVar12,auVar54,auVar49);
          uVar25 = *(undefined4 *)((long)puVar26 + 0x34);
          auVar50._4_4_ = uVar25;
          auVar50._0_4_ = uVar25;
          auVar50._8_4_ = uVar25;
          auVar50._12_4_ = uVar25;
          auVar50._16_4_ = uVar25;
          auVar50._20_4_ = uVar25;
          auVar50._24_4_ = uVar25;
          auVar50._28_4_ = uVar25;
          uVar25 = (undefined4)puVar26[8];
          auVar55._4_4_ = uVar25;
          auVar55._0_4_ = uVar25;
          auVar55._8_4_ = uVar25;
          auVar55._12_4_ = uVar25;
          auVar55._16_4_ = uVar25;
          auVar55._20_4_ = uVar25;
          auVar55._24_4_ = uVar25;
          auVar55._28_4_ = uVar25;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = puVar26[uVar16 + 2];
          auVar12 = vpmovzxbd_avx2(auVar2);
          auVar12 = vcvtdq2ps_avx(auVar12);
          auVar52 = vfmadd213ps_fma(auVar12,auVar55,auVar50);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((long)puVar26 + (uVar16 * 8 + 0x10 ^ 8));
          auVar12 = vpmovzxbd_avx2(auVar3);
          auVar12 = vcvtdq2ps_avx(auVar12);
          auVar53 = vfmadd213ps_fma(auVar12,auVar55,auVar50);
          uVar25 = (undefined4)puVar26[7];
          auVar51._4_4_ = uVar25;
          auVar51._0_4_ = uVar25;
          auVar51._8_4_ = uVar25;
          auVar51._12_4_ = uVar25;
          auVar51._16_4_ = uVar25;
          auVar51._20_4_ = uVar25;
          auVar51._24_4_ = uVar25;
          auVar51._28_4_ = uVar25;
          uVar25 = *(undefined4 *)((long)puVar26 + 0x44);
          auVar56._4_4_ = uVar25;
          auVar56._0_4_ = uVar25;
          auVar56._8_4_ = uVar25;
          auVar56._12_4_ = uVar25;
          auVar56._16_4_ = uVar25;
          auVar56._20_4_ = uVar25;
          auVar56._24_4_ = uVar25;
          auVar56._28_4_ = uVar25;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = puVar26[uVar18 + 4];
          auVar12 = vpmovzxbd_avx2(auVar4);
          auVar12 = vcvtdq2ps_avx(auVar12);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)((long)puVar26 + (uVar18 * 8 + 0x20 ^ 8));
          auVar49 = vpmovzxbd_avx2(auVar5);
          auVar13 = vfmadd213ps_fma(auVar12,auVar56,auVar51);
          auVar12 = vcvtdq2ps_avx(auVar49);
          auVar57 = vfmadd213ps_fma(auVar12,auVar56,auVar51);
          auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar67._0_32_,auVar79._0_32_);
          auVar52 = vfmadd213ps_fma(ZEXT1632(auVar52),auVar71._0_32_,auVar82._0_32_);
          auVar12 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar52));
          auVar9 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar77._0_32_,auVar85._0_32_);
          auVar49 = vpmaxsd_avx2(ZEXT1632(auVar9),auVar87._0_32_);
          local_2560 = vpmaxsd_avx2(auVar12,auVar49);
          auVar9 = vfmadd213ps_fma(ZEXT1632(auVar10),auVar67._0_32_,auVar79._0_32_);
          auVar10 = vfmadd213ps_fma(ZEXT1632(auVar53),auVar71._0_32_,auVar82._0_32_);
          auVar12 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar10));
          auVar9 = vfmadd213ps_fma(ZEXT1632(auVar57),auVar77._0_32_,auVar85._0_32_);
          auVar49 = vpminsd_avx2(ZEXT1632(auVar9),auVar36._0_32_);
          auVar12 = vpminsd_avx2(auVar12,auVar49);
          auVar12 = vpcmpgtd_avx2(local_2560,auVar12);
          uVar25 = vmovmskps_avx(auVar12);
          bVar24 = ~(byte)uVar25 &
                   (SUB161(auVar8 >> 7,0) & 1 | (SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                    (SUB161(auVar8 >> 0x17,0) & 1) << 2 | (SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                    (SUB161(auVar8 >> 0x27,0) & 1) << 4 | (SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                    (SUB161(auVar8 >> 0x37,0) & 1) << 6 | SUB161(auVar8 >> 0x3f,0) << 7);
          if (bVar24 == 0) {
            if (pauVar17 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_019b0fe7;
          }
          lVar32 = 0;
          for (uVar22 = (ulong)bVar24; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
          {
            lVar32 = lVar32 + 1;
          }
          uVar22 = *(ulong *)(uVar19 + lVar32 * 8);
          uVar29 = bVar24 - 1 & (uint)bVar24;
          uVar30 = (ulong)uVar29;
          pauVar15 = pauVar17;
          if (uVar29 != 0) {
            uVar59 = *(uint *)(local_2560 + lVar32 * 4);
            lVar32 = 0;
            for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              lVar32 = lVar32 + 1;
            }
            uVar29 = uVar29 - 1 & uVar29;
            uVar27 = (ulong)uVar29;
            uVar30 = *(ulong *)(uVar19 + lVar32 * 8);
            uVar68 = *(uint *)(local_2560 + lVar32 * 4);
            if (uVar29 == 0) {
              pauVar15 = pauVar17 + 1;
              if (uVar59 < uVar68) {
                *(ulong *)*pauVar17 = uVar30;
                *(uint *)(*pauVar17 + 8) = uVar68;
              }
              else {
                *(ulong *)*pauVar17 = uVar22;
                *(uint *)(*pauVar17 + 8) = uVar59;
                uVar22 = uVar30;
              }
            }
            else {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar22;
              auVar8 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar59));
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar30;
              auVar9 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar68));
              lVar32 = 0;
              for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                lVar32 = lVar32 + 1;
              }
              uVar29 = uVar29 - 1 & uVar29;
              uVar22 = (ulong)uVar29;
              auVar44._8_8_ = 0;
              auVar44._0_8_ = *(ulong *)(uVar19 + lVar32 * 8);
              auVar10 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_2560 + lVar32 * 4)));
              if (uVar29 == 0) {
                auVar52 = vpcmpgtd_avx(auVar9,auVar8);
                auVar53 = vpshufd_avx(auVar52,0xaa);
                auVar52 = vblendvps_avx(auVar9,auVar8,auVar53);
                auVar8 = vblendvps_avx(auVar8,auVar9,auVar53);
                auVar9 = vpcmpgtd_avx(auVar10,auVar52);
                auVar53 = vpshufd_avx(auVar9,0xaa);
                auVar9 = vblendvps_avx(auVar10,auVar52,auVar53);
                auVar10 = vblendvps_avx(auVar52,auVar10,auVar53);
                auVar52 = vpcmpgtd_avx(auVar10,auVar8);
                auVar53 = vpshufd_avx(auVar52,0xaa);
                auVar52 = vblendvps_avx(auVar10,auVar8,auVar53);
                auVar8 = vblendvps_avx(auVar8,auVar10,auVar53);
                *pauVar17 = auVar8;
                pauVar17[1] = auVar52;
                uVar22 = auVar9._0_8_;
                pauVar15 = pauVar17 + 2;
              }
              else {
                lVar32 = 0;
                for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  lVar32 = lVar32 + 1;
                }
                uVar29 = uVar29 - 1 & uVar29;
                uVar30 = (ulong)uVar29;
                auVar46._8_8_ = 0;
                auVar46._0_8_ = *(ulong *)(uVar19 + lVar32 * 8);
                auVar52 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_2560 + lVar32 * 4)));
                if (uVar29 == 0) {
                  auVar53 = vpcmpgtd_avx(auVar9,auVar8);
                  auVar13 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar9,auVar8,auVar13);
                  auVar8 = vblendvps_avx(auVar8,auVar9,auVar13);
                  auVar9 = vpcmpgtd_avx(auVar52,auVar10);
                  auVar13 = vpshufd_avx(auVar9,0xaa);
                  auVar9 = vblendvps_avx(auVar52,auVar10,auVar13);
                  auVar10 = vblendvps_avx(auVar10,auVar52,auVar13);
                  auVar52 = vpcmpgtd_avx(auVar10,auVar8);
                  auVar13 = vpshufd_avx(auVar52,0xaa);
                  auVar52 = vblendvps_avx(auVar10,auVar8,auVar13);
                  auVar8 = vblendvps_avx(auVar8,auVar10,auVar13);
                  auVar10 = vpcmpgtd_avx(auVar9,auVar53);
                  auVar13 = vpshufd_avx(auVar10,0xaa);
                  auVar10 = vblendvps_avx(auVar9,auVar53,auVar13);
                  auVar9 = vblendvps_avx(auVar53,auVar9,auVar13);
                  auVar53 = vpcmpgtd_avx(auVar52,auVar9);
                  auVar13 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar52,auVar9,auVar13);
                  auVar9 = vblendvps_avx(auVar9,auVar52,auVar13);
                  *pauVar17 = auVar8;
                  pauVar17[1] = auVar9;
                  pauVar17[2] = auVar53;
                  uVar22 = auVar10._0_8_;
                  pauVar15 = pauVar17 + 3;
                }
                else {
                  *pauVar17 = auVar8;
                  pauVar17[1] = auVar9;
                  pauVar17[2] = auVar10;
                  pauVar17[3] = auVar52;
                  lVar32 = 0x30;
                  do {
                    lVar28 = lVar32;
                    lVar32 = 0;
                    for (uVar22 = uVar30; (uVar22 & 1) == 0;
                        uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                      lVar32 = lVar32 + 1;
                    }
                    uVar22 = *(ulong *)(uVar19 + lVar32 * 8);
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = uVar22;
                    auVar8 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_2560 + lVar32 * 4)));
                    *(undefined1 (*) [16])(pauVar17[1] + lVar28) = auVar8;
                    uVar30 = uVar30 - 1 & uVar30;
                    lVar32 = lVar28 + 0x10;
                  } while (uVar30 != 0);
                  pauVar15 = (undefined1 (*) [16])(pauVar17[1] + lVar28);
                  if (lVar28 + 0x10 != 0) {
                    lVar32 = 0x10;
                    pauVar31 = pauVar17;
                    do {
                      auVar8 = pauVar31[1];
                      pauVar31 = pauVar31 + 1;
                      uVar29 = vextractps_avx(auVar8,2);
                      lVar28 = lVar32;
                      do {
                        if (uVar29 <= *(uint *)(pauVar17[-1] + lVar28 + 8)) {
                          pauVar23 = (undefined1 (*) [16])(*pauVar17 + lVar28);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar17 + lVar28) =
                             *(undefined1 (*) [16])(pauVar17[-1] + lVar28);
                        lVar28 = lVar28 + -0x10;
                        pauVar23 = pauVar17;
                      } while (lVar28 != 0);
                      *pauVar23 = auVar8;
                      lVar32 = lVar32 + 0x10;
                    } while (pauVar15 != pauVar31);
                    uVar22 = *(ulong *)*pauVar15;
                  }
                }
              }
            }
          }
        }
        uVar19 = (ulong)((uint)uVar22 & 0xf);
        if (uVar19 != 8) {
          uVar22 = uVar22 & 0xfffffffffffffff0;
          lVar32 = 0;
          do {
            lVar28 = lVar32 * 0xb0;
            auVar8 = *(undefined1 (*) [16])(uVar22 + 0x80 + lVar28);
            auVar9 = *(undefined1 (*) [16])(uVar22 + 0x40 + lVar28);
            auVar10 = *(undefined1 (*) [16])(uVar22 + 0x70 + lVar28);
            auVar52 = *(undefined1 (*) [16])(uVar22 + 0x50 + lVar28);
            auVar33._0_4_ = auVar8._0_4_ * auVar9._0_4_;
            auVar33._4_4_ = auVar8._4_4_ * auVar9._4_4_;
            auVar33._8_4_ = auVar8._8_4_ * auVar9._8_4_;
            auVar33._12_4_ = auVar8._12_4_ * auVar9._12_4_;
            local_24d0 = vfmsub231ps_fma(auVar33,auVar10,auVar52);
            auVar53 = *(undefined1 (*) [16])(uVar22 + 0x60 + lVar28);
            auVar13 = *(undefined1 (*) [16])(uVar22 + 0x30 + lVar28);
            auVar39._0_4_ = auVar52._0_4_ * auVar53._0_4_;
            auVar39._4_4_ = auVar52._4_4_ * auVar53._4_4_;
            auVar39._8_4_ = auVar52._8_4_ * auVar53._8_4_;
            auVar39._12_4_ = auVar52._12_4_ * auVar53._12_4_;
            local_24c0 = vfmsub231ps_fma(auVar39,auVar8,auVar13);
            uVar25 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar72._4_4_ = uVar25;
            auVar72._0_4_ = uVar25;
            auVar72._8_4_ = uVar25;
            auVar72._12_4_ = uVar25;
            auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + lVar28),auVar72);
            uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar73._4_4_ = uVar25;
            auVar73._0_4_ = uVar25;
            auVar73._8_4_ = uVar25;
            auVar73._12_4_ = uVar25;
            auVar2 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x10 + lVar28),auVar73);
            uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar74._4_4_ = uVar25;
            auVar74._0_4_ = uVar25;
            auVar74._8_4_ = uVar25;
            auVar74._12_4_ = uVar25;
            auVar3 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + lVar28),auVar74);
            fVar60 = (ray->super_RayK<1>).dir.field_0.m128[0];
            auVar75._4_4_ = fVar60;
            auVar75._0_4_ = fVar60;
            auVar75._8_4_ = fVar60;
            auVar75._12_4_ = fVar60;
            fVar61 = (ray->super_RayK<1>).dir.field_0.m128[1];
            auVar78._4_4_ = fVar61;
            auVar78._0_4_ = fVar61;
            auVar78._8_4_ = fVar61;
            auVar78._12_4_ = fVar61;
            fVar62 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar80._4_4_ = fVar62;
            auVar80._0_4_ = fVar62;
            auVar80._8_4_ = fVar62;
            auVar80._12_4_ = fVar62;
            auVar83._0_4_ = fVar60 * auVar2._0_4_;
            auVar83._4_4_ = fVar60 * auVar2._4_4_;
            auVar83._8_4_ = fVar60 * auVar2._8_4_;
            auVar83._12_4_ = fVar60 * auVar2._12_4_;
            auVar4 = vfmsub231ps_fma(auVar83,auVar57,auVar78);
            auVar70._0_4_ = auVar8._0_4_ * auVar4._0_4_;
            auVar70._4_4_ = auVar8._4_4_ * auVar4._4_4_;
            auVar70._8_4_ = auVar8._8_4_ * auVar4._8_4_;
            auVar70._12_4_ = auVar8._12_4_ * auVar4._12_4_;
            auVar84._0_4_ = auVar52._0_4_ * auVar4._0_4_;
            auVar84._4_4_ = auVar52._4_4_ * auVar4._4_4_;
            auVar84._8_4_ = auVar52._8_4_ * auVar4._8_4_;
            auVar84._12_4_ = auVar52._12_4_ * auVar4._12_4_;
            auVar65._0_4_ = fVar62 * auVar57._0_4_;
            auVar65._4_4_ = fVar62 * auVar57._4_4_;
            auVar65._8_4_ = fVar62 * auVar57._8_4_;
            auVar65._12_4_ = fVar62 * auVar57._12_4_;
            auVar52 = vfmsub231ps_fma(auVar65,auVar3,auVar75);
            auVar8 = vfmadd231ps_fma(auVar70,auVar52,auVar10);
            auVar52 = vfmadd231ps_fma(auVar84,auVar9,auVar52);
            auVar64._0_4_ = auVar10._0_4_ * auVar13._0_4_;
            auVar64._4_4_ = auVar10._4_4_ * auVar13._4_4_;
            auVar64._8_4_ = auVar10._8_4_ * auVar13._8_4_;
            auVar64._12_4_ = auVar10._12_4_ * auVar13._12_4_;
            local_24b0[0] = vfmsub231ps_fma(auVar64,auVar53,auVar9);
            auVar86._0_4_ = fVar61 * auVar3._0_4_;
            auVar86._4_4_ = fVar61 * auVar3._4_4_;
            auVar86._8_4_ = fVar61 * auVar3._8_4_;
            auVar86._12_4_ = fVar61 * auVar3._12_4_;
            auVar4 = vfmsub231ps_fma(auVar86,auVar2,auVar80);
            auVar81._0_4_ = local_24b0[0]._0_4_ * fVar62;
            auVar81._4_4_ = local_24b0[0]._4_4_ * fVar62;
            auVar81._8_4_ = local_24b0[0]._8_4_ * fVar62;
            auVar81._12_4_ = local_24b0[0]._12_4_ * fVar62;
            auVar9 = vfmadd231ps_fma(auVar81,local_24c0,auVar78);
            auVar10 = vfmadd231ps_fma(auVar9,local_24d0,auVar75);
            auVar9 = vfmadd231ps_fma(auVar8,auVar4,auVar53);
            auVar58._8_8_ = 0x8000000080000000;
            auVar58._0_8_ = 0x8000000080000000;
            auVar8 = vandps_avx(auVar10,auVar58);
            uVar29 = auVar8._0_4_;
            local_2560._0_4_ = (float)(uVar29 ^ auVar9._0_4_);
            uVar59 = auVar8._4_4_;
            local_2560._4_4_ = (float)(uVar59 ^ auVar9._4_4_);
            uVar68 = auVar8._8_4_;
            local_2560._8_4_ = (float)(uVar68 ^ auVar9._8_4_);
            uVar69 = auVar8._12_4_;
            local_2560._12_4_ = (float)(uVar69 ^ auVar9._12_4_);
            auVar8 = vfmadd231ps_fma(auVar52,auVar13,auVar4);
            local_2560._16_4_ = (float)(uVar29 ^ auVar8._0_4_);
            local_2560._20_4_ = (float)(uVar59 ^ auVar8._4_4_);
            local_2560._24_4_ = (float)(uVar68 ^ auVar8._8_4_);
            local_2560._28_4_ = (float)(uVar69 ^ auVar8._12_4_);
            auVar52 = ZEXT416(0) << 0x20;
            auVar8 = vcmpps_avx(local_2560._0_16_,auVar52,5);
            auVar9 = vcmpps_avx(local_2560._16_16_,auVar52,5);
            auVar8 = vandps_avx(auVar9,auVar8);
            local_2530 = vandps_avx(auVar10,local_2490);
            auVar9 = vcmpps_avx(auVar10,auVar52,4);
            auVar8 = vandps_avx(auVar8,auVar9);
            auVar76._0_4_ = local_2560._0_4_ + local_2560._16_4_;
            auVar76._4_4_ = local_2560._4_4_ + local_2560._20_4_;
            auVar76._8_4_ = local_2560._8_4_ + local_2560._24_4_;
            auVar76._12_4_ = local_2560._12_4_ + local_2560._28_4_;
            auVar9 = vcmpps_avx(auVar76,local_2530,2);
            auVar8 = vandps_avx(auVar8,auVar9);
            auVar11._8_8_ = uStack_2568;
            auVar11._0_8_ = local_2570;
            auVar11 = auVar11 & auVar8;
            if ((((auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar11 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar11[0xf] < '\0') {
              auVar14._8_8_ = uStack_2568;
              auVar14._0_8_ = local_2570;
              auVar8 = vandps_avx(auVar8,auVar14);
              auVar47._0_4_ = local_24b0[0]._0_4_ * auVar3._0_4_;
              auVar47._4_4_ = local_24b0[0]._4_4_ * auVar3._4_4_;
              auVar47._8_4_ = local_24b0[0]._8_4_ * auVar3._8_4_;
              auVar47._12_4_ = local_24b0[0]._12_4_ * auVar3._12_4_;
              auVar9 = vfmadd213ps_fma(auVar2,local_24c0,auVar47);
              auVar9 = vfmadd213ps_fma(auVar57,local_24d0,auVar9);
              local_2540._0_4_ = (float)(uVar29 ^ auVar9._0_4_);
              local_2540._4_4_ = (float)(uVar59 ^ auVar9._4_4_);
              local_2540._8_4_ = (float)(uVar68 ^ auVar9._8_4_);
              local_2540._12_4_ = (float)(uVar69 ^ auVar9._12_4_);
              fVar60 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar42._0_4_ = local_2530._0_4_ * fVar60;
              auVar42._4_4_ = local_2530._4_4_ * fVar60;
              auVar42._8_4_ = local_2530._8_4_ * fVar60;
              auVar42._12_4_ = local_2530._12_4_ * fVar60;
              auVar9 = vcmpps_avx(auVar42,local_2540,1);
              fVar60 = (ray->super_RayK<1>).tfar;
              auVar48._0_4_ = local_2530._0_4_ * fVar60;
              auVar48._4_4_ = local_2530._4_4_ * fVar60;
              auVar48._8_4_ = local_2530._8_4_ * fVar60;
              auVar48._12_4_ = local_2530._12_4_ * fVar60;
              auVar10 = vcmpps_avx(local_2540,auVar48,2);
              auVar9 = vandps_avx(auVar10,auVar9);
              auVar10 = auVar8 & auVar9;
              if ((((auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar10[0xf] < '\0') {
                auVar66._0_4_ = (ray->super_RayK<1>).tfar;
                auVar66._4_4_ = (ray->super_RayK<1>).mask;
                auVar66._8_4_ = (ray->super_RayK<1>).id;
                auVar66._12_4_ = (ray->super_RayK<1>).flags;
                auVar8 = vandps_avx(auVar8,auVar9);
                local_2510 = auVar8;
                local_25a8 = context->scene;
                local_2610 = auVar8;
                auVar9 = vrcpps_avx(local_2530);
                auVar40._8_4_ = 0x3f800000;
                auVar40._0_8_ = 0x3f8000003f800000;
                auVar40._12_4_ = 0x3f800000;
                auVar10 = vfnmadd213ps_fma(local_2530,auVar9,auVar40);
                auVar9 = vfmadd132ps_fma(auVar10,auVar9,auVar9);
                fVar60 = auVar9._0_4_;
                local_25f0._0_4_ = fVar60 * local_2540._0_4_;
                fVar61 = auVar9._4_4_;
                local_25f0._4_4_ = fVar61 * local_2540._4_4_;
                fVar62 = auVar9._8_4_;
                local_25f0._8_4_ = fVar62 * local_2540._8_4_;
                fVar63 = auVar9._12_4_;
                local_25f0._12_4_ = fVar63 * local_2540._12_4_;
                local_24e0 = local_25f0;
                local_2500[0] = fVar60 * local_2560._0_4_;
                local_2500[1] = fVar61 * local_2560._4_4_;
                local_2500[2] = fVar62 * local_2560._8_4_;
                local_2500[3] = fVar63 * local_2560._12_4_;
                local_24f0[0] = fVar60 * local_2560._16_4_;
                local_24f0[1] = fVar61 * local_2560._20_4_;
                local_24f0[2] = fVar62 * local_2560._24_4_;
                local_24f0[3] = fVar63 * local_2560._28_4_;
                auVar34._8_4_ = 0x7f800000;
                auVar34._0_8_ = 0x7f8000007f800000;
                auVar34._12_4_ = 0x7f800000;
                auVar9 = vblendvps_avx(auVar34,local_25f0,auVar8);
                auVar10 = vshufps_avx(auVar9,auVar9,0xb1);
                auVar10 = vminps_avx(auVar10,auVar9);
                auVar52 = vshufpd_avx(auVar10,auVar10,1);
                auVar10 = vminps_avx(auVar52,auVar10);
                auVar9 = vcmpps_avx(auVar9,auVar10,0);
                auVar10 = auVar8 & auVar9;
                if ((((auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar10[0xf] < '\0') {
                  auVar8 = vandps_avx(auVar9,auVar8);
                }
                lVar28 = lVar28 + uVar22;
                uVar29 = vextractps_avx(auVar66,1);
                uVar25 = vmovmskps_avx(auVar8);
                piVar20 = (int *)0x0;
                for (uVar30 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar25);
                    (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                  piVar20 = (int *)((long)piVar20 + 1);
                }
                do {
                  uVar59 = *(uint *)(lVar28 + 0x90 + (long)piVar20 * 4);
                  pGVar6 = (local_25a8->geometries).items[uVar59].ptr;
                  if ((pGVar6->mask & uVar29) == 0) {
                    *(undefined4 *)(local_2610 + (long)piVar20 * 4) = 0;
                  }
                  else {
                    pRVar7 = context->args;
                    if (pRVar7->filter == (RTCFilterFunctionN)0x0) {
                      pRVar21 = context->user;
                      if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar60 = local_2500[(long)piVar20];
                        fVar61 = local_24f0[(long)piVar20];
                        (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + (long)piVar20 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_24d0 + (long)piVar20 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_24c0 + (long)piVar20 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_24b0[0] + (long)piVar20 * 4);
                        ray->u = fVar60;
                        ray->v = fVar61;
                        ray->primID = *(uint *)(lVar28 + 0xa0 + (long)piVar20 * 4);
                        ray->geomID = uVar59;
                        ray->instID[0] = pRVar21->instID[0];
                        ray->instPrimID[0] = pRVar21->instPrimID[0];
                        break;
                      }
                      local_2600 = auVar66;
                    }
                    else {
                      local_2600 = auVar66;
                      pRVar21 = context->user;
                    }
                    local_25a0 = *(undefined4 *)(local_24d0 + (long)piVar20 * 4);
                    local_259c = *(undefined4 *)(local_24c0 + (long)piVar20 * 4);
                    local_2598 = *(undefined4 *)(local_24b0[0] + (long)piVar20 * 4);
                    local_2594 = local_2500[(long)piVar20];
                    local_2590 = local_24f0[(long)piVar20];
                    local_258c = *(undefined4 *)(lVar28 + 0xa0 + (long)piVar20 * 4);
                    local_2588 = uVar59;
                    local_2584 = pRVar21->instID[0];
                    local_2580 = pRVar21->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + (long)piVar20 * 4);
                    local_2614 = -1;
                    local_25d8.valid = &local_2614;
                    local_25d8.geometryUserPtr = pGVar6->userPtr;
                    local_25d8.context = pRVar21;
                    local_25d8.ray = (RTCRayN *)ray;
                    local_25d8.hit = (RTCHitN *)&local_25a0;
                    local_25d8.N = 1;
                    local_2600 = auVar66;
                    if (((pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar6->intersectionFilterN)(&local_25d8), *local_25d8.valid != 0)) &&
                       ((pRVar7->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((pGVar6->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*pRVar7->filter)(&local_25d8), *local_25d8.valid != 0)))))) {
                      (((Vec3f *)((long)local_25d8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25d8.hit;
                      (((Vec3f *)((long)local_25d8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25d8.hit + 4);
                      (((Vec3f *)((long)local_25d8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25d8.hit + 8);
                      *(float *)((long)local_25d8.ray + 0x3c) = *(float *)(local_25d8.hit + 0xc);
                      *(float *)((long)local_25d8.ray + 0x40) = *(float *)(local_25d8.hit + 0x10);
                      *(float *)((long)local_25d8.ray + 0x44) = *(float *)(local_25d8.hit + 0x14);
                      *(float *)((long)local_25d8.ray + 0x48) = *(float *)(local_25d8.hit + 0x18);
                      *(float *)((long)local_25d8.ray + 0x4c) = *(float *)(local_25d8.hit + 0x1c);
                      *(float *)((long)local_25d8.ray + 0x50) = *(float *)(local_25d8.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_2600._0_4_;
                    }
                    *(undefined4 *)(local_2610 + (long)piVar20 * 4) = 0;
                    fVar60 = (ray->super_RayK<1>).tfar;
                    auVar35._4_4_ = fVar60;
                    auVar35._0_4_ = fVar60;
                    auVar35._8_4_ = fVar60;
                    auVar35._12_4_ = fVar60;
                    auVar8 = vcmpps_avx(local_25f0,auVar35,2);
                    local_2610 = vandps_avx(auVar8,local_2610);
                    auVar66._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar66._4_4_ = (ray->super_RayK<1>).mask;
                    auVar66._8_4_ = (ray->super_RayK<1>).id;
                    auVar66._12_4_ = (ray->super_RayK<1>).flags;
                    uVar29 = vextractps_avx(auVar66,1);
                  }
                  local_2600 = auVar66;
                  if ((((local_2610 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2610 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2610 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2610[0xf]) break;
                  BVHNIntersector1<8,1048576,false,embree::avx2::ArrayIntersector1<embree::avx2::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect(&local_25d8);
                  piVar20 = local_25d8.valid;
                  auVar66 = local_2600;
                } while( true );
              }
            }
            lVar32 = lVar32 + 1;
          } while (lVar32 != uVar19 - 8);
        }
        fVar60 = (ray->super_RayK<1>).tfar;
        auVar36 = ZEXT3264(CONCAT428(fVar60,CONCAT424(fVar60,CONCAT420(fVar60,CONCAT416(fVar60,
                                                  CONCAT412(fVar60,CONCAT48(fVar60,CONCAT44(fVar60,
                                                  fVar60))))))));
        auVar67 = ZEXT3264(local_23c0);
        auVar71 = ZEXT3264(local_23e0);
        auVar77 = ZEXT3264(local_2400);
        auVar79 = ZEXT3264(local_2420);
        auVar82 = ZEXT3264(local_2440);
        auVar85 = ZEXT3264(local_2460);
        auVar87 = ZEXT3264(local_2480);
      }
    } while (pauVar17 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }